

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readSecondaryTemperatures.hpp
# Opt level: O2

vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
* __thiscall
njoy::ENDFtk::section::Type<7,4>::
readSecondaryTemperatures<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
          (vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
           *__return_storage_ptr__,Type<7,4> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT,
          stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>
          *types)

{
  member_size_t<const_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
  mVar1;
  range_reference_t<const_D<true>_> pdVar2;
  int iVar3;
  undefined4 in_stack_00000014;
  _Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature> local_158;
  TabulationRecord local_c0;
  
  mVar1 = ranges::
          stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
          ::size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                    ((stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>
                      *)CONCAT44(in_stack_00000014,MT));
  (__return_storage_ptr__->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
  ::reserve(__return_storage_ptr__,mVar1 & 0xffffffff);
  while (iVar3 = (int)mVar1,
        mVar1 = (member_size_t<const_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
                 )(iVar3 - 1), iVar3 != 0) {
    pdVar2 = ranges::
             view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
             ::operator[]<true,_true,_0,_0>
                       ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                         *)CONCAT44(in_stack_00000014,MT),
                        ((long)(__return_storage_ptr__->
                               super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(__return_storage_ptr__->
                              super__Vector_base<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>,_std::allocator<std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x98);
    if ((*pdVar2 != 0.0) || (NAN(*pdVar2))) {
      local_158._M_engaged = false;
      std::
      vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
      ::emplace_back<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>
                ((vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
                  *)__return_storage_ptr__,
                 (optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature> *)&local_158);
      std::_Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>::_M_reset
                (&local_158);
    }
    else {
      EffectiveTemperature::
      EffectiveTemperature<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((EffectiveTemperature *)&local_c0,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,begin,(long *)end,(int)lineNumber,MAT,MF);
      std::optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>::
      optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature,_true>
                ((optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature> *)&local_158,
                 (EffectiveTemperature *)&local_c0);
      std::
      vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
      ::emplace_back<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>
                ((vector<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>,std::allocator<std::optional<njoy::ENDFtk::section::Type<7,4>::EffectiveTemperature>>>
                  *)__return_storage_ptr__,
                 (optional<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature> *)&local_158);
      std::_Optional_payload_base<njoy::ENDFtk::section::Type<7,_4>::EffectiveTemperature>::_M_reset
                (&local_158);
      TabulationRecord::~TabulationRecord(&local_c0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector< std::optional< EffectiveTemperature > >
readSecondaryTemperatures( Iterator& begin,
                           const Iterator& end,
                           long& lineNumber,
                           int MAT,
                           int MF,
                           int MT,
                           const Array& types ) {
  unsigned int size = types.size();
  std::vector< std::optional< EffectiveTemperature > > sequence;
  sequence.reserve( size );

  while( size-- ){
    if ( types[ sequence.size() ] == 0 ) {
      sequence.push_back( EffectiveTemperature( begin, end, lineNumber,
                                                MAT, MF, MT ) );
    }
    else {
      sequence.push_back( std::nullopt );
    }
  }

  return sequence;
}